

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O3

MPP_RET jpegd_setup_output_fmt(JpegdHalCtx *ctx,JpegdSyntax *s,RK_S32 output)

{
  MppFrameFormat MVar1;
  MppFrameFormat MVar2;
  undefined8 uVar3;
  RK_U32 v;
  uint uVar4;
  MppFrame frm;
  MppFrame local_38;
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","enter\n","jpegd_setup_output_fmt");
  }
  local_38 = (MppFrame)0x0;
  if ((ctx->have_pp != 0) && (ctx->set_output_fmt_flag != 0)) {
    MVar2 = ctx->output_fmt;
    MVar1 = s->output_fmt;
    if (MVar2 != MVar1) {
      switch(MVar1) {
      case MPP_FMT_YUV400:
        uVar4 = 3;
        break;
      case MPP_FMT_YUV440SP:
        uVar4 = 6;
        break;
      case MPP_FMT_YUV411SP:
        uVar4 = 8;
        break;
      case MPP_FMT_YUV444SP:
        uVar4 = 7;
        break;
      default:
        if (MVar1 == MPP_FMT_YUV422SP) {
          uVar4 = 4;
        }
        else if (MVar1 == MPP_FMT_YUV420SP) {
          uVar4 = 1;
        }
        else {
          uVar4 = 0;
          if (((byte)jpegd_debug & 0x80) != 0) {
            uVar4 = 0;
            _mpp_log_l(4,"HAL_JPEGD_COMMON","other output format %d\n",(char *)0x0);
            MVar2 = ctx->output_fmt;
          }
        }
      }
      (ctx->pp_info).pp_enable = '\x01';
      (ctx->pp_info).pp_in_fmt = (RK_U8)uVar4;
      MVar1 = MVar2 & 0xfffff;
      if ((MVar2 >> 0x18 & 1) == 0) {
        MVar1 = MVar2;
      }
      if (MVar1 - MPP_FMT_RGB565 < 6) {
        (ctx->pp_info).pp_out_fmt = '\0';
        v = s->hor_stride * 2;
        uVar3 = 0;
      }
      else if (MVar1 - MPP_FMT_ARGB8888 < 4) {
        (ctx->pp_info).pp_out_fmt = '\x01';
        v = s->hor_stride << 2;
        uVar3 = 1;
      }
      else {
        (ctx->pp_info).pp_out_fmt = '\x05';
        v = 0;
        uVar3 = 5;
      }
      if (((byte)jpegd_debug & 0x80) != 0) {
        _mpp_log_l(4,"HAL_JPEGD_COMMON","Post Process! pp_in_fmt:%d, pp_out_fmt:%d",(char *)0x0,
                   (ulong)uVar4,uVar3);
      }
      goto LAB_00212367;
    }
  }
  ctx->output_fmt = s->output_fmt;
  (ctx->pp_info).pp_enable = '\0';
  v = 0;
LAB_00212367:
  mpp_buf_slot_get_prop(ctx->frame_slots,output,SLOT_FRAME_PTR,&local_38);
  mpp_frame_set_fmt(local_38,ctx->output_fmt);
  mpp_frame_set_hor_stride_pixel(local_38,s->hor_stride);
  if (v != 0) {
    mpp_frame_set_hor_stride(local_38,v);
  }
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","exit\n","jpegd_setup_output_fmt");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_setup_output_fmt(JpegdHalCtx *ctx, JpegdSyntax *s, RK_S32 output)
{
    jpegd_dbg_func("enter\n");
    RK_U32 pp_in_fmt = 0;
    RK_U32 stride = 0;
    PPInfo *pp_info = &ctx->pp_info;
    MppFrame frm = NULL;
    MPP_RET ret = MPP_OK;

    if (ctx->have_pp && ctx->set_output_fmt_flag &&
        ctx->output_fmt != s->output_fmt) {
        MppFrameFormat fmt = MPP_FMT_BUTT;

        /* Using pp to convert all format to yuv420sp */
        switch (s->output_fmt) {
        case MPP_FMT_YUV400:
            pp_in_fmt = PP_IN_FORMAT_YUV400;
            break;
        case MPP_FMT_YUV420SP:
            pp_in_fmt = PP_IN_FORMAT_YUV420SEMI;
            break;
        case MPP_FMT_YUV422SP:
            pp_in_fmt = PP_IN_FORMAT_YUV422SEMI;
            break;
        case MPP_FMT_YUV440SP:
            pp_in_fmt = PP_IN_FORMAT_YUV440SEMI;
            break;
        case MPP_FMT_YUV411SP:
            pp_in_fmt = PP_IN_FORMAT_YUV411_SEMI;
            break;
        case MPP_FMT_YUV444SP:
            pp_in_fmt = PP_IN_FORMAT_YUV444_SEMI;
            break;
        default:
            jpegd_dbg_hal("other output format %d\n", s->output_fmt);
            break;
        }

        pp_info->pp_enable = 1;
        pp_info->pp_in_fmt = pp_in_fmt;

        fmt = ctx->output_fmt;

        if (MPP_FRAME_FMT_IS_LE(fmt)) {
            fmt &= MPP_FRAME_FMT_MASK;
        }

        switch (fmt) {
        case MPP_FMT_RGB565 :
        case MPP_FMT_BGR565 :
        case MPP_FMT_RGB555 :
        case MPP_FMT_BGR555 :
        case MPP_FMT_RGB444 :
        case MPP_FMT_BGR444 : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_RGB565;
            stride = s->hor_stride * 2;
        } break;
        case MPP_FMT_ARGB8888 :
        case MPP_FMT_ABGR8888 :
        case MPP_FMT_RGBA8888 :
        case MPP_FMT_BGRA8888 : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_ARGB;
            stride = s->hor_stride * 4;
        } break;
        default : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_YUV420INTERLAVE;
        } break;
        }

        jpegd_dbg_hal("Post Process! pp_in_fmt:%d, pp_out_fmt:%d",
                      pp_in_fmt, pp_info->pp_out_fmt);
    } else {
        /* keep original output format */
        ctx->output_fmt = s->output_fmt;
        pp_info->pp_enable = 0;
    }

    mpp_buf_slot_get_prop(ctx->frame_slots, output,
                          SLOT_FRAME_PTR, &frm);
    mpp_frame_set_fmt(frm, ctx->output_fmt);
    mpp_frame_set_hor_stride_pixel(frm, s->hor_stride);
    /* update RGBX format byte stride and pixel stride */
    if (stride)
        mpp_frame_set_hor_stride(frm, stride);

    jpegd_dbg_func("exit\n");
    return ret;
}